

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

object * __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage::
value_abi_cxx11_(object_storage *this)

{
  string *s;
  long in_RDI;
  assertion_error *this_00;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 8) == 0) {
    s = (string *)__cxa_allocate_exception(0x10);
    this_00 = (assertion_error *)&stack0xffffffffffffffd7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    assertion_error::assertion_error(this_00,s);
    __cxa_throw(s,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  return *(object **)(in_RDI + 8);
}

Assistant:

object& value()
            {
                JSONCONS_ASSERT(ptr_ != nullptr);
                return *ptr_;
            }